

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O2

bool CheckEverySoOften(float *_lastCheck,float _interval,float _now)

{
  float fVar1;
  bool bVar2;
  
  fVar1 = *_lastCheck;
  bVar2 = _interval + fVar1 <= _now;
  if (fVar1 < 1e-05 || bVar2) {
    *_lastCheck = _now;
  }
  return fVar1 < 1e-05 || bVar2;
}

Assistant:

bool CheckEverySoOften (float& _lastCheck, float _interval, float _now)
{
    if (_lastCheck < 0.00001f ||
        _now >= _lastCheck + _interval) {
        _lastCheck = _now;
        return true;
    }
    return false;
}